

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall testing::internal::UnitTestImpl::ShouldWarnIfNoTestsMatchFilter(UnitTestImpl *this)

{
  pointer ppTVar1;
  TestSuite *pTVar2;
  pointer ppTVar3;
  bool bVar4;
  int iVar5;
  pointer ppTVar6;
  string *in_RSI;
  pointer ppTVar7;
  bool bVar8;
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  PositiveAndNegativeUnitTestFilter local_d0;
  
  iVar5 = total_test_count(this);
  if (iVar5 == 0) {
    bVar8 = false;
  }
  else {
    anon_unknown_37::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
              (&local_d0,in_RSI);
    ppTVar1 = (this->test_suites_).
              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar6 = (this->test_suites_).
                   super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; bVar8 = ppTVar6 == ppTVar1, !bVar8;
        ppTVar6 = ppTVar6 + 1) {
      pTVar2 = *ppTVar6;
      ppTVar7 = (pTVar2->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 = (pTVar2->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      while (ppTVar7 != ppTVar3) {
        bVar4 = anon_unknown_37::PositiveAndNegativeUnitTestFilter::MatchesTest
                          (&local_d0,&pTVar2->name_,&(*ppTVar7)->name_);
        ppTVar7 = ppTVar7 + 1;
        if (bVar4) goto LAB_00143418;
      }
    }
LAB_00143418:
    anon_unknown_37::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter
              (&local_d0);
  }
  return bVar8;
}

Assistant:

bool UnitTestImpl::ShouldWarnIfNoTestsMatchFilter() const {
  if (total_test_count() == 0) {
    // No tests were linked in to program.
    // This case is handled by a different warning.
    return false;
  }
  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name_;
    for (TestInfo* test_info : test_suite->test_info_list()) {
      const std::string& test_name = test_info->name_;
      if (gtest_flag_filter.MatchesTest(test_suite_name, test_name)) {
        return false;
      }
    }
  }
  return true;
}